

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftstream.c
# Opt level: O2

FT_Error FT_Stream_Seek(FT_Stream stream,FT_ULong pos)

{
  unsigned_long uVar1;
  
  if (stream->read == (FT_Stream_IoFunc)0x0) {
    if (pos <= stream->size) goto LAB_00136f6a;
  }
  else {
    uVar1 = (*stream->read)(stream,pos,(uchar *)0x0,0);
    if (uVar1 == 0) {
LAB_00136f6a:
      stream->pos = pos;
      return 0;
    }
  }
  return 0x55;
}

Assistant:

FT_BASE_DEF( FT_Error )
  FT_Stream_Seek( FT_Stream  stream,
                  FT_ULong   pos )
  {
    FT_Error  error = FT_Err_Ok;


    if ( stream->read )
    {
      if ( stream->read( stream, pos, 0, 0 ) )
      {
        FT_ERROR(( "FT_Stream_Seek:"
                   " invalid i/o; pos = 0x%lx, size = 0x%lx\n",
                   pos, stream->size ));

        error = FT_THROW( Invalid_Stream_Operation );
      }
    }
    /* note that seeking to the first position after the file is valid */
    else if ( pos > stream->size )
    {
      FT_ERROR(( "FT_Stream_Seek:"
                 " invalid i/o; pos = 0x%lx, size = 0x%lx\n",
                 pos, stream->size ));

      error = FT_THROW( Invalid_Stream_Operation );
    }

    if ( !error )
      stream->pos = pos;

    return error;
  }